

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O2

void fmt::v5::internal::format_value<char,EmptyTest>(basic_buffer<char> *buffer,EmptyTest *value)

{
  formatbuf<char> format_buf;
  basic_ostream<char,_std::char_traits<char>_> output;
  
  formatbuf<char>::formatbuf(&format_buf,buffer);
  std::ostream::ostream(&output,&format_buf.super_basic_streambuf<char,_std::char_traits<char>_>);
  std::ios::exceptions((int)&output + (int)output._vptr_basic_ostream[-3]);
  std::operator<<(&output,"");
  basic_buffer<char>::resize(buffer,buffer->size_);
  std::ios_base::~ios_base((ios_base *)&output.field_0x8);
  std::streambuf::~streambuf(&format_buf);
  return;
}

Assistant:

void format_value(basic_buffer<Char> &buffer, const T &value) {
  internal::formatbuf<Char> format_buf(buffer);
  std::basic_ostream<Char> output(&format_buf);
  output.exceptions(std::ios_base::failbit | std::ios_base::badbit);
  output << value;
  buffer.resize(buffer.size());
}